

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiCond cond)

{
  ImU32 key;
  void *pvVar1;
  ImGuiStorage *this;
  
  this = &GImGui->WindowsById;
  key = ImHash(name,0,0);
  pvVar1 = ImGuiStorage::GetVoidPtr(this,key);
  if ((pvVar1 != (void *)0x0) && ((cond == 0 || ((cond & *(uint *)((long)pvVar1 + 0xb4)) != 0)))) {
    *(uint *)((long)pvVar1 + 0xb4) = *(uint *)((long)pvVar1 + 0xb4) & 0xfffffff1;
    *(bool *)((long)pvVar1 + 0x7d) = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiCond cond)
{
    if (ImGuiWindow* window = FindWindowByName(name))
        SetWindowCollapsed(window, collapsed, cond);
}